

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void color_tree_add(ColorTree *tree,uchar r,uchar g,uchar b,uchar a,uint index)

{
  int iVar1;
  ColorTree *pCVar2;
  byte bVar3;
  int local_1c;
  int i;
  int bit;
  uint index_local;
  uchar a_local;
  uchar b_local;
  uchar g_local;
  uchar r_local;
  ColorTree *tree_local;
  
  _index_local = tree;
  for (local_1c = 0; local_1c < 8; local_1c = local_1c + 1) {
    bVar3 = (byte)local_1c;
    iVar1 = ((int)(uint)r >> (bVar3 & 0x1f) & 1U) * 8 + ((int)(uint)g >> (bVar3 & 0x1f) & 1U) * 4 +
            ((int)(uint)b >> (bVar3 & 0x1f) & 1U) * 2 + ((int)(uint)a >> (bVar3 & 0x1f) & 1U);
    if (_index_local->children[iVar1] == (ColorTree *)0x0) {
      pCVar2 = (ColorTree *)lodepng_malloc(0x88);
      _index_local->children[iVar1] = pCVar2;
      color_tree_init(_index_local->children[iVar1]);
    }
    _index_local = _index_local->children[iVar1];
  }
  _index_local->index = index;
  return;
}

Assistant:

static void color_tree_add(ColorTree* tree,
                           unsigned char r, unsigned char g, unsigned char b, unsigned char a, unsigned index)
{
  int bit;
  for(bit = 0; bit < 8; bit++)
  {
    int i = 8 * ((r >> bit) & 1) + 4 * ((g >> bit) & 1) + 2 * ((b >> bit) & 1) + 1 * ((a >> bit) & 1);
    if(!tree->children[i])
    {
      tree->children[i] = (ColorTree*)lodepng_malloc(sizeof(ColorTree));
      color_tree_init(tree->children[i]);
    }
    tree = tree->children[i];
  }
  tree->index = (int)index;
}